

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

int fits_img_stats_int(int *array,long nx,long ny,int nullcheck,int nullvalue,long *ngoodpix,
                      int *minvalue,int *maxvalue,double *mean,double *sigma,double *noise1,
                      double *noise2,double *noise3,double *noise5,int *status)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  double *pdVar4;
  double *arr;
  double *arr_00;
  double *__ptr;
  double *__base;
  double *__base_00;
  long lVar5;
  LONGLONG LVar6;
  int iVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  size_t sVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  ulong npix;
  size_t sVar23;
  ulong uVar24;
  size_t sVar25;
  int *piVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  int local_11c;
  size_t local_110;
  int local_fc;
  int local_cc;
  long local_b0;
  size_t local_a8;
  int local_94;
  size_t local_88;
  int local_7c;
  long local_78;
  long ngood;
  double local_58;
  long local_50;
  double xsigma;
  double xmean;
  double mean_1;
  
  xmean = 0.0;
  xsigma = 0.0;
  if (mean != (double *)0x0 || sigma != (double *)0x0) {
    FnMeanSigma_int(array,ny * nx,nullcheck,nullvalue,&ngood,&xmean,&xsigma,status);
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = ngood;
    }
    if (mean != (double *)0x0) {
      *mean = xmean;
    }
    if (sigma != (double *)0x0) {
      *sigma = xsigma;
    }
  }
  if (noise1 != (double *)0x0) {
    dVar27 = 0.0;
    if (2 < nx) {
      piVar3 = (int *)calloc(nx,4);
      if (piVar3 == (int *)0x0) {
        *status = 0x71;
      }
      else {
        pdVar4 = (double *)calloc(ny,8);
        if (pdVar4 != (double *)0x0) {
          lVar20 = 0;
          lVar5 = 0;
          if (0 < ny) {
            lVar5 = ny;
          }
          local_110 = 0;
          piVar26 = array;
          for (; lVar20 != lVar5; lVar20 = lVar20 + 1) {
            if (nullcheck == 0) {
              iVar13 = array[lVar20 * nx];
              lVar16 = 0;
LAB_001ec41d:
              uVar24 = 0;
              while (lVar10 = lVar16 + 1, lVar10 < nx) {
                if (nullcheck == 0) {
                  iVar14 = (array + lVar20 * nx)[lVar16 + 1];
                }
                else {
                  while( true ) {
                    if (nx <= lVar10) goto LAB_001ec457;
                    iVar14 = piVar26[lVar10];
                    if (iVar14 != nullvalue) break;
                    lVar10 = lVar10 + 1;
                  }
                }
                piVar3[uVar24] = iVar13 - iVar14;
                uVar24 = uVar24 + 1;
                lVar16 = lVar10;
                iVar13 = iVar14;
              }
LAB_001ec457:
              if (1 < uVar24) {
                FnMeanSigma_int(piVar3,uVar24,0,0,(long *)0x0,&mean_1,&local_58,status);
                if (0.0 < local_58) {
                  for (iVar13 = 0; iVar13 != 3; iVar13 = iVar13 + 1) {
                    uVar21 = 0;
                    if (0 < (long)uVar24) {
                      uVar21 = uVar24;
                    }
                    npix = 0;
                    for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
                      if (ABS((double)piVar3[uVar8] - mean_1) < local_58 * 5.0) {
                        if ((long)npix < (long)uVar8) {
                          piVar3[npix] = piVar3[uVar8];
                        }
                        npix = npix + 1;
                      }
                    }
                    if (npix == uVar24) break;
                    FnMeanSigma_int(piVar3,npix,0,0,(long *)0x0,&mean_1,&local_58,status);
                    uVar24 = npix;
                  }
                }
                pdVar4[local_110] = local_58;
                local_110 = local_110 + 1;
              }
            }
            else {
              for (lVar16 = 0; nx != lVar16; lVar16 = lVar16 + 1) {
                iVar13 = piVar26[lVar16];
                if (iVar13 != nullvalue) goto LAB_001ec41d;
              }
            }
            piVar26 = piVar26 + nx;
          }
          if (local_110 == 0) {
            dVar27 = 0.0;
          }
          else if (local_110 == 1) {
            dVar27 = *pdVar4;
          }
          else {
            qsort(pdVar4,local_110,8,FnCompare_double);
            dVar27 = (pdVar4[(long)(local_110 - 1) / 2] + pdVar4[(long)local_110 / 2]) * 0.5;
          }
          dVar27 = dVar27 * 0.70710678;
          free(pdVar4);
          free(piVar3);
          goto LAB_001ec6cf;
        }
        free(piVar3);
        *status = 0x71;
      }
      dVar27 = 0.0;
    }
LAB_001ec6cf:
    *noise1 = dVar27;
  }
  if ((minvalue == (int *)0x0 && maxvalue == (int *)0x0) && noise3 == (double *)0x0)
  goto LAB_001ecf39;
  sVar23 = 1;
  if (nx < 9) {
    sVar23 = ny;
    ny = 1;
  }
  sVar23 = sVar23 * nx;
  if ((long)sVar23 < 9) {
    ngood = 0;
    if ((long)sVar23 < 1) {
      sVar23 = ngood;
    }
    iVar14 = -0x80000000;
    iVar13 = 0x7fffffff;
    for (sVar9 = 0; sVar23 != sVar9; sVar9 = sVar9 + 1) {
      iVar7 = array[sVar9];
      if ((nullcheck == 0) || (iVar7 != nullvalue)) {
        if (iVar7 < iVar13) {
          iVar13 = iVar7;
        }
        if (iVar14 < iVar7) {
          iVar14 = iVar7;
        }
        ngood = ngood + 1;
      }
    }
    dVar27 = 0.0;
    dVar28 = 0.0;
    dVar29 = 0.0;
  }
  else {
    pdVar4 = (double *)calloc(sVar23,8);
    if (pdVar4 != (double *)0x0) {
      arr = (double *)calloc(sVar23,8);
      if (arr != (double *)0x0) {
        arr_00 = (double *)calloc(sVar23,8);
        if (arr_00 == (double *)0x0) {
          free(pdVar4);
          pdVar4 = arr;
        }
        else {
          __ptr = (double *)calloc(ny,8);
          if (__ptr == (double *)0x0) {
            free(pdVar4);
            free(arr);
            pdVar4 = arr_00;
          }
          else {
            __base = (double *)calloc(ny,8);
            if (__base == (double *)0x0) {
              free(pdVar4);
              free(arr);
              free(arr_00);
              pdVar4 = __ptr;
            }
            else {
              __base_00 = (double *)calloc(ny,8);
              if (__base_00 != (double *)0x0) {
                sVar9 = 0;
                if (ny < 1) {
                  ny = sVar9;
                }
                iVar14 = -0x80000000;
                iVar13 = 0x7fffffff;
                local_a8 = 0;
                local_88 = 0;
                piVar3 = array;
                for (sVar25 = 0; sVar25 != ny; sVar25 = sVar25 + 1) {
                  if (nullcheck == 0) {
                    sVar11 = 0;
LAB_001ec868:
                    if (sVar11 != sVar23) {
                      lVar5 = sVar25 * sVar23;
                      iVar7 = array[lVar5 + sVar11];
                      if (iVar7 < iVar13) {
                        iVar13 = iVar7;
                      }
                      if (iVar14 < iVar7) {
                        iVar14 = iVar7;
                      }
                      sVar11 = sVar11 + 1;
                      sVar12 = sVar11;
                      if (nullcheck != 0) {
                        sVar17 = sVar11;
                        if (sVar23 - sVar11 != 0 && (long)sVar11 <= (long)sVar23) {
                          sVar17 = sVar23;
                        }
                        for (; (sVar12 = sVar17, (long)sVar11 < (long)sVar23 &&
                               (sVar12 = sVar11, piVar3[sVar11] == nullvalue)); sVar11 = sVar11 + 1)
                        {
                        }
                      }
                      if (sVar12 == sVar23) {
                        sVar9 = sVar9 + 1;
                      }
                      else {
                        iVar15 = array[lVar5 + sVar12];
                        if (iVar15 < iVar13) {
                          iVar13 = iVar15;
                        }
                        if (iVar14 < iVar15) {
                          iVar14 = iVar15;
                        }
                        sVar12 = sVar12 + 1;
                        sVar11 = sVar12;
                        if (nullcheck != 0) {
                          sVar17 = sVar12;
                          if (sVar23 - sVar12 != 0 && (long)sVar12 <= (long)sVar23) {
                            sVar17 = sVar23;
                          }
                          for (; (sVar11 = sVar17, (long)sVar12 < (long)sVar23 &&
                                 (sVar11 = sVar12, piVar3[sVar12] == nullvalue));
                              sVar12 = sVar12 + 1) {
                          }
                        }
                        if (sVar11 == sVar23) {
                          sVar9 = sVar9 + 2;
                        }
                        else {
                          iVar18 = array[lVar5 + sVar11];
                          if (iVar18 < iVar13) {
                            iVar13 = iVar18;
                          }
                          if (iVar14 < iVar18) {
                            iVar14 = iVar18;
                          }
                          sVar11 = sVar11 + 1;
                          sVar12 = sVar11;
                          if (nullcheck != 0) {
                            sVar17 = sVar11;
                            if (sVar23 - sVar11 != 0 && (long)sVar11 <= (long)sVar23) {
                              sVar17 = sVar23;
                            }
                            for (; (sVar12 = sVar17, (long)sVar11 < (long)sVar23 &&
                                   (sVar12 = sVar11, piVar3[sVar11] == nullvalue));
                                sVar11 = sVar11 + 1) {
                            }
                          }
                          if (sVar12 == sVar23) {
                            sVar9 = sVar9 + 3;
                          }
                          else {
                            local_cc = array[lVar5 + sVar12];
                            if (local_cc < iVar13) {
                              iVar13 = local_cc;
                            }
                            if (iVar14 < local_cc) {
                              iVar14 = local_cc;
                            }
                            sVar12 = sVar12 + 1;
                            sVar11 = sVar12;
                            if (nullcheck != 0) {
                              sVar17 = sVar12;
                              if (sVar23 - sVar12 != 0 && (long)sVar12 <= (long)sVar23) {
                                sVar17 = sVar23;
                              }
                              for (; (sVar11 = sVar17, (long)sVar12 < (long)sVar23 &&
                                     (sVar11 = sVar12, piVar3[sVar12] == nullvalue));
                                  sVar12 = sVar12 + 1) {
                              }
                            }
                            if (sVar11 == sVar23) {
                              sVar9 = sVar9 + 4;
                            }
                            else {
                              local_11c = array[lVar5 + sVar11];
                              if (local_11c < iVar13) {
                                iVar13 = local_11c;
                              }
                              if (iVar14 < local_11c) {
                                iVar14 = local_11c;
                              }
                              sVar11 = sVar11 + 1;
                              sVar12 = sVar11;
                              if (nullcheck != 0) {
                                sVar17 = sVar11;
                                if (sVar23 - sVar11 != 0 && (long)sVar11 <= (long)sVar23) {
                                  sVar17 = sVar23;
                                }
                                for (; (sVar12 = sVar17, (long)sVar11 < (long)sVar23 &&
                                       (sVar12 = sVar11, piVar3[sVar11] == nullvalue));
                                    sVar11 = sVar11 + 1) {
                                }
                              }
                              if (sVar12 == sVar23) {
                                sVar9 = sVar9 + 5;
                              }
                              else {
                                local_fc = array[lVar5 + sVar12];
                                if (local_fc < iVar13) {
                                  iVar13 = local_fc;
                                }
                                if (iVar14 < local_fc) {
                                  iVar14 = local_fc;
                                }
                                sVar12 = sVar12 + 1;
                                sVar11 = sVar12;
                                if (nullcheck != 0) {
                                  sVar17 = sVar12;
                                  if (sVar23 - sVar12 != 0 && (long)sVar12 <= (long)sVar23) {
                                    sVar17 = sVar23;
                                  }
                                  for (; (sVar11 = sVar17, (long)sVar12 < (long)sVar23 &&
                                         (sVar11 = sVar12, piVar3[sVar12] == nullvalue));
                                      sVar12 = sVar12 + 1) {
                                  }
                                }
                                if (sVar11 == sVar23) {
                                  sVar9 = sVar9 + 6;
                                }
                                else {
                                  local_94 = array[lVar5 + sVar11];
                                  if (local_94 < iVar13) {
                                    iVar13 = local_94;
                                  }
                                  if (iVar14 < local_94) {
                                    iVar14 = local_94;
                                  }
                                  sVar11 = sVar11 + 1;
                                  sVar12 = sVar11;
                                  if (nullcheck != 0) {
                                    sVar17 = sVar11;
                                    if (sVar23 - sVar11 != 0 && (long)sVar11 <= (long)sVar23) {
                                      sVar17 = sVar23;
                                    }
                                    for (; (sVar12 = sVar17, (long)sVar11 < (long)sVar23 &&
                                           (sVar12 = sVar11, piVar3[sVar11] == nullvalue));
                                        sVar11 = sVar11 + 1) {
                                    }
                                  }
                                  if (sVar12 != sVar23) {
                                    iVar22 = array[lVar5 + sVar12];
                                    lVar20 = sVar9 + 8;
                                    if (iVar22 < iVar13) {
                                      iVar13 = iVar22;
                                    }
                                    if (iVar14 < iVar22) {
                                      iVar14 = iVar22;
                                    }
                                    local_78 = 0;
                                    local_b0 = 0;
LAB_001ecacc:
                                    iVar2 = local_11c;
                                    local_11c = local_fc;
                                    local_fc = local_94;
                                    iVar1 = iVar15;
                                    iVar15 = iVar18;
                                    local_7c = iVar7;
                                    do {
                                      iVar19 = iVar2;
                                      local_94 = iVar22;
                                      iVar7 = iVar1;
                                      sVar9 = sVar12 + 1;
                                      if ((long)sVar23 <= (long)sVar9) {
LAB_001ecc8e:
                                        sVar9 = lVar20 + local_b0;
                                        if (local_b0 != 0) {
                                          if (local_b0 == 1) {
                                            if (local_78 == 1) {
                                              __ptr[local_a8] = (double)(long)*pdVar4;
                                              local_a8 = local_a8 + 1;
                                            }
                                            __base[local_88] = (double)(long)*arr;
                                            dVar27 = *arr_00;
                                          }
                                          else {
                                            iVar7 = (int)local_b0;
                                            if (1 < local_78) {
                                              LVar6 = quick_select_longlong
                                                                ((LONGLONG *)pdVar4,iVar7);
                                              __ptr[local_a8] = (double)LVar6;
                                              local_a8 = local_a8 + 1;
                                            }
                                            LVar6 = quick_select_longlong((LONGLONG *)arr,iVar7);
                                            __base[local_88] = (double)LVar6;
                                            dVar27 = (double)quick_select_longlong
                                                                       ((LONGLONG *)arr_00,iVar7);
                                          }
                                          __base_00[local_88] = (double)(long)dVar27;
                                          local_88 = local_88 + 1;
                                        }
                                        goto LAB_001ecd17;
                                      }
                                      if (nullcheck == 0) {
                                        iVar22 = array[lVar5 + sVar12 + 1];
                                        sVar12 = sVar9;
                                      }
                                      else {
                                        while( true ) {
                                          if ((long)sVar23 <= (long)sVar9) goto LAB_001ecc8e;
                                          iVar22 = piVar3[sVar9];
                                          sVar12 = sVar9;
                                          if (iVar22 != nullvalue) break;
                                          sVar9 = sVar9 + 1;
                                        }
                                      }
                                      if (iVar22 < iVar13) {
                                        iVar13 = iVar22;
                                      }
                                      if (iVar14 < iVar22) {
                                        iVar14 = iVar22;
                                      }
                                      local_50 = (long)iVar19;
                                      if (local_11c != local_fc || iVar19 != local_11c) {
                                        uVar21 = local_50 - local_fc;
                                        uVar24 = -uVar21;
                                        if (0 < (long)uVar21) {
                                          uVar24 = uVar21;
                                        }
                                        pdVar4[local_78] = (double)(uVar24 & 0xffffffff);
                                        local_78 = local_78 + 1;
                                      }
                                      if ((((iVar15 == local_cc) && (local_cc == iVar19)) &&
                                          (iVar19 == local_11c)) && (local_11c == local_fc))
                                      goto LAB_001ecc79;
                                      lVar16 = (long)local_fc + (long)iVar15;
                                      dVar28 = (double)(local_50 * 2 - lVar16);
                                      dVar27 = (double)-(long)dVar28;
                                      if (0 < (long)dVar28) {
                                        dVar27 = dVar28;
                                      }
                                      arr[local_b0] = dVar27;
                                      dVar28 = (double)((long)local_7c + local_50 * 6 + lVar16 * -4
                                                       + (long)iVar22);
                                      dVar27 = (double)-(long)dVar28;
                                      if (0 < (long)dVar28) {
                                        dVar27 = dVar28;
                                      }
                                      arr_00[local_b0] = dVar27;
                                      local_b0 = local_b0 + 1;
                                      iVar1 = iVar15;
                                      iVar15 = local_cc;
                                      iVar2 = local_11c;
                                      local_11c = local_fc;
                                      local_fc = local_94;
                                      local_cc = iVar19;
                                      local_7c = iVar7;
                                    } while( true );
                                  }
                                  sVar9 = sVar9 + 7;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    for (sVar11 = 0; sVar23 - sVar11 != 0; sVar11 = sVar11 + 1) {
                      if (piVar3[sVar11] != nullvalue) goto LAB_001ec868;
                    }
                  }
LAB_001ecd17:
                  piVar3 = piVar3 + sVar23;
                }
                if (local_88 == 0) {
                  dVar27 = 0.0;
                  dVar28 = 0.0;
                }
                else if (local_88 == 1) {
                  dVar27 = *__base;
                  dVar28 = *__base_00;
                }
                else {
                  qsort(__base,local_88,8,FnCompare_double);
                  qsort(__base_00,local_88,8,FnCompare_double);
                  lVar5 = (long)(local_88 - 1) / 2;
                  dVar27 = (__base[(long)local_88 / 2] + __base[lVar5]) * 0.5;
                  dVar28 = (__base_00[(long)local_88 / 2] + __base_00[lVar5]) * 0.5;
                }
                if (local_a8 == 0) {
                  dVar29 = 0.0;
                }
                else if (local_a8 == 1) {
                  dVar29 = *__ptr;
                }
                else {
                  qsort(__ptr,local_a8,8,FnCompare_double);
                  dVar29 = (__ptr[(long)(local_a8 - 1) / 2] + __ptr[(long)local_a8 / 2]) * 0.5;
                }
                dVar29 = dVar29 * 1.0483579;
                dVar27 = dVar27 * 0.6052697;
                dVar28 = dVar28 * 0.1772048;
                ngood = sVar9;
                free(__base_00);
                free(__base);
                free(__ptr);
                free(arr_00);
                free(arr);
                free(pdVar4);
                goto LAB_001eceee;
              }
              free(pdVar4);
              free(arr);
              free(arr_00);
              free(__ptr);
              pdVar4 = __base;
            }
          }
        }
      }
      free(pdVar4);
    }
    *status = 0x71;
    dVar27 = 0.0;
    dVar28 = 0.0;
    dVar29 = 0.0;
    iVar13 = 0;
    iVar14 = 0;
  }
LAB_001eceee:
  if (ngoodpix != (long *)0x0) {
    *ngoodpix = ngood;
  }
  if (minvalue != (int *)0x0) {
    *minvalue = iVar13;
  }
  if (maxvalue != (int *)0x0) {
    *maxvalue = iVar14;
  }
  if (noise2 != (double *)0x0) {
    *noise2 = dVar29;
  }
  if (noise3 != (double *)0x0) {
    *noise3 = dVar27;
  }
  if (noise5 != (double *)0x0) {
    *noise5 = dVar28;
  }
LAB_001ecf39:
  return *status;
LAB_001ecc79:
  lVar20 = lVar20 + 1;
  iVar18 = local_cc;
  local_cc = iVar19;
  goto LAB_001ecacc;
}

Assistant:

int fits_img_stats_int(int *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	int nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	int *minvalue,    /* returned minimum non-null value in the array */
	int *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input integer image.
*/
{
	long ngood;
	int minval = 0, maxval = 0;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_int(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_int(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_int(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}